

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_server.cpp
# Opt level: O3

bool __thiscall AutoReconnectConnection::disconnected(AutoReconnectConnection *this,bool imm)

{
  long lVar1;
  int iVar2;
  int *piVar3;
  timespec local_20;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"minibus disconnected",0x14);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  lVar1 = (this->delay).__r;
  if (0 < lVar1) {
    local_20.tv_nsec = 0;
    local_20.tv_sec = lVar1;
    do {
      iVar2 = nanosleep(&local_20,&local_20);
      if (iVar2 != -1) break;
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reconnecting",0xc);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  return true;
}

Assistant:

bool disconnected(bool imm) override {
    std::cout << "minibus disconnected" << std::endl;
    std::this_thread::sleep_for(delay);
    std::cout << "reconnecting" << std::endl;
    return true;
  }